

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasByInstruction
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas,VRInstruction *vrinst)

{
  ulong *puVar1;
  CallInst *I;
  byte bVar2;
  bool bVar3;
  long lVar4;
  const_iterator cVar5;
  ulong uVar6;
  CallInst *pCVar7;
  long lVar8;
  undefined8 *puVar9;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar10;
  undefined1 auVar11 [16];
  AnalysisOptions options;
  key_type local_88;
  AnalysisOptions local_68;
  
  I = (CallInst *)vrinst->instruction;
  if (I[0x10] == (CallInst)0x53) {
    bVar3 = llvm::IntrinsicInst::classof(I);
    pCVar7 = (CallInst *)0x0;
    if (bVar3) {
      pCVar7 = I;
    }
  }
  else {
    if (I[0x10] == (CallInst)0x3a) {
      puVar9 = *(undefined8 **)(this + 0xb8);
      uVar6 = 0;
      if (puVar9 != *(undefined8 **)(this + 0xc0)) {
        do {
          if ((CallInst *)*puVar9 == I) goto LAB_00127240;
          uVar6 = (ulong)((int)uVar6 + 1);
          puVar9 = puVar9 + 4;
        } while (puVar9 != *(undefined8 **)(this + 0xc0));
        uVar6 = 0;
      }
LAB_00127240:
      puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar6 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
    }
    pCVar7 = (CallInst *)0x0;
  }
  if ((pCVar7 != (CallInst *)0x0) && (*(int *)(*(long *)(pCVar7 + -0x20) + 0x24) == 0xa4)) {
    pVar10 = getEqualArea(this,&location->relations,
                          *(Value **)(pCVar7 + (0x20 - (ulong)(uint)(*(int *)(pCVar7 + 0x14) << 5)))
                         );
    bVar2 = (byte)pVar10.first & 0x3f;
    puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (pVar10.first >> 6);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
  }
  if ((I != (CallInst *)0x0) && (I[0x10] == (CallInst)0x53)) {
    lVar4 = *(long *)(I + -0x20);
    lVar8 = 0;
    if ((lVar4 != 0) && (*(char *)(lVar4 + 0x10) == '\0')) {
      lVar8 = lVar4;
    }
    if ((lVar8 == 0) || (*(long *)(lVar8 + 0x18) != *(long *)(I + 0x48))) {
      lVar8 = 0;
    }
    if (lVar8 != 0) {
      AnalysisOptions::AnalysisOptions(&local_68);
      auVar11 = llvm::Value::getName();
      lVar4 = auVar11._0_8_;
      if (lVar4 == 0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,lVar4,auVar11._8_8_ + lVar4);
      }
      cVar5 = std::
              _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
              ::find(&local_68.allocationFunctions._M_t,&local_88);
      if ((_Rb_tree_header *)cVar5._M_node ==
          &local_68.allocationFunctions._M_t._M_impl.super__Rb_tree_header) {
        bVar3 = false;
      }
      else {
        bVar3 = cVar5._M_node[2]._M_color == 4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if (bVar3) {
        pVar10 = getEqualArea(this,&location->relations,
                              *(Value **)(I + -(ulong)(uint)(*(int *)(I + 0x14) << 5)));
        if (pVar10.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(I + -(ulong)(uint)(*(int *)(I + 0x14) << 5)) + 0x10) != '\x12') {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          bVar2 = (byte)pVar10.first & 0x3f;
          puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (pVar10.first >> 6);
          *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
      }
      auVar11 = llvm::Value::getName();
      if ((auVar11._8_8_ == 4) && (*auVar11._0_8_ == 0x65657266)) {
        pVar10 = getEqualArea(this,&location->relations,
                              *(Value **)(I + -(ulong)(uint)(*(int *)(I + 0x14) << 5)));
        if (pVar10.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(I + -(ulong)(uint)(*(int *)(I + 0x14) << 5)) + 0x10) != '\x12') {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          bVar2 = (byte)pVar10.first & 0x3f;
          puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (pVar10.first >> 6);
          *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
      }
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&local_68.allocationFunctions._M_t,
                 (_Link_type)
                 local_68.allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
    }
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasByInstruction(
        VRLocation &location, std::vector<bool> &validAreas,
        VRInstruction *vrinst) const {
    const llvm::Instruction *inst = vrinst->getInstruction();
    unsigned index = 0;
    const AllocatedArea *area = nullptr;

    // every memory allocated on stack is considered allocated successfully
    if (llvm::isa<llvm::AllocaInst>(inst)) {
        std::tie(index, area) = getAllocatedAreaFor(inst);
        assert(area);
        validAreas[index] = true;
    }

    // if came across lifetime_end call, then mark memory whose scope ended
    // invalid
    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (intrinsic->getIntrinsicID() == llvm::Intrinsic::lifetime_end) {
            std::tie(index, area) =
                    getEqualArea(location.relations, intrinsic->getOperand(1));
            assert(area);
            validAreas[index] = false;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        auto *function = call->getCalledFunction();

        if (!function)
            return;

        AnalysisOptions options;
        if (options.getAllocationFunction(function->getName().str()) ==
            AllocationFunction::REALLOC) {
            // if realloc of memory occured, the reallocated memory cannot
            // be considered valid until the realloc is proven unsuccessful
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));
            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been reallocated and
                // thus possibly invalidated, so it may have been any of
                // them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }

        if (function->getName().equals("free")) {
            // if free occures, the freed memory cannot be considered valid
            // anymore
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));

            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been freed, so it may
                // have been any of them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }
    }
}